

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
FactoredDecPOMDPDiscrete::ClipRewardModel(FactoredDecPOMDPDiscrete *this,Index sf,bool sparse)

{
  ulong uVar1;
  long lVar2;
  RewardModelMappingSparse *this_00;
  size_t sVar3;
  ulong uVar4;
  Index sI;
  size_t nrS;
  size_t i;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  undefined8 extraout_XMM0_Qb;
  
  if (this->_m_cached_FlatRM == true) {
    if (this->_m_p_rModel != (RewardModel *)0x0) {
      (*(this->_m_p_rModel->super_RewardModelDiscreteInterface).super_QTableInterface.
        _vptr_QTableInterface[3])();
    }
    this->_m_cached_FlatRM = false;
  }
  this->_m_sparse_FlatRM = sparse;
  nrS = 1;
  uVar5 = 0;
  while( true ) {
    uVar1 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                   super_MultiAgentDecisionProcess + 0xa8))(this);
    if (uVar1 <= uVar5) break;
    if (sf != uVar5) {
      lVar2 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                     super_MultiAgentDecisionProcess + 0xc0))
                        (this,uVar5 & 0xffffffff);
      nrS = nrS * lVar2;
    }
    uVar5 = uVar5 + 1;
  }
  if (sparse) {
    this_00 = (RewardModelMappingSparse *)operator_new(200);
    sVar3 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                   super_MultiAgentDecisionProcess + 0x110))(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"s",&local_69);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"ja",&local_6a);
    RewardModelMappingSparse::RewardModelMappingSparse(this_00,nrS,sVar3,&local_48,&local_68);
  }
  else {
    this_00 = (RewardModelMappingSparse *)operator_new(0x80);
    sVar3 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                   super_MultiAgentDecisionProcess + 0x110))(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"s",&local_69);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"ja",&local_6a);
    RewardModelMapping::RewardModelMapping
              ((RewardModelMapping *)this_00,nrS,sVar3,&local_48,&local_68);
  }
  this->_m_p_rModel = &this_00->super_RewardModel;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  for (uVar5 = 0; uVar5 < nrS; uVar5 = (ulong)((int)uVar5 + 1)) {
    uVar1 = 0;
    while( true ) {
      uVar4 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                     super_MultiAgentDecisionProcess + 0x110))(this);
      if (uVar4 <= uVar1) break;
      auVar7._0_8_ = (**(code **)(*(long *)&(this->
                                            super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                            super_MultiAgentDecisionProcess + 0x2d0))
                               (this,uVar5,uVar1);
      auVar7._8_8_ = extraout_XMM0_Qb;
      auVar6._8_8_ = 0x7fffffffffffffff;
      auVar6._0_8_ = 0x7fffffffffffffff;
      auVar6 = vandpd_avx512vl(auVar7,auVar6);
      if (1e-12 <= auVar6._0_8_) {
        (*(this->_m_p_rModel->super_RewardModelDiscreteInterface).super_QTableInterface.
          _vptr_QTableInterface[1])(this->_m_p_rModel,uVar5,uVar1);
      }
      uVar1 = (ulong)((int)uVar1 + 1);
    }
  }
  this->_m_cached_FlatRM = true;
  return;
}

Assistant:

void FactoredDecPOMDPDiscrete::ClipRewardModel(Index sf, bool sparse)
{
    if(_m_cached_FlatRM){
        delete(_m_p_rModel);
        _m_cached_FlatRM = false;
    }

    _m_sparse_FlatRM = sparse;

    size_t nrS = 1;
    for(size_t i = 0; i < GetNrStateFactors(); i++){
      if(i == sf)
        continue;
      size_t nrX = GetNrValuesForFactor(i);
      nrS *= nrX;
    }

    if(sparse)
        _m_p_rModel=new RewardModelMappingSparse(nrS,
                                                 GetNrJointActions());
    else
        _m_p_rModel=new RewardModelMapping(nrS,
                                           GetNrJointActions());

    for(Index sI=0; sI<nrS; sI++)
        for(Index jaI=0; jaI<GetNrJointActions(); jaI++)
        {
            double r = GetReward(sI, jaI);
        
            if( abs(r) >= REWARD_PRECISION )                
                _m_p_rModel->Set(sI, jaI, r);
        }

    _m_cached_FlatRM = true;
}